

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>::operator()
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>
           *this,Boxed_Value *param)

{
  Type_Conversions *this_00;
  Conversion_Saves *pCVar1;
  Boxed_Value *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  Function_Params local_140;
  undefined1 local_130 [8];
  Type_Conversions_State state_1;
  Type_Conversions conv;
  Function_Params local_68;
  undefined1 local_58 [8];
  Type_Conversions_State state;
  undefined1 local_30 [8];
  array<chaiscript::Boxed_Value,_1UL> params;
  Boxed_Value *param_local;
  Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&> *this_local
  ;
  
  box<chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>
            ((Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&> *
             )local_30,in_RDX);
  if (param[1].m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Type_Conversions::Type_Conversions((Type_Conversions *)&state_1.m_saves);
    pCVar1 = Type_Conversions::conversion_saves((Type_Conversions *)&state_1.m_saves);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)local_130,(Type_Conversions *)&state_1.m_saves,pCVar1);
    Function_Params::Function_Params<1ul>
              (&local_140,(array<chaiscript::Boxed_Value,_1UL> *)local_30);
    Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::call
              ((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                *)this,(Function_Params *)param,(Type_Conversions_State *)&local_140);
    Type_Conversions::~Type_Conversions((Type_Conversions *)&state_1.m_saves);
  }
  else {
    this_00 = (Type_Conversions *)
              param[1].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    pCVar1 = Type_Conversions::conversion_saves(this_00);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)local_58,this_00,pCVar1);
    Function_Params::Function_Params<1ul>(&local_68,(array<chaiscript::Boxed_Value,_1UL> *)local_30)
    ;
    Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::call
              ((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                *)this,(Function_Params *)param,(Type_Conversions_State *)&local_68);
  }
  std::array<chaiscript::Boxed_Value,_1UL>::~array((array<chaiscript::Boxed_Value,_1UL> *)local_30);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }